

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

void __thiscall
ON_OBSOLETE_V5_Annotation::SetType(ON_OBSOLETE_V5_Annotation *this,V5_eAnnotationType type)

{
  wchar_t *pwVar1;
  V5_eAnnotationType type_local;
  ON_OBSOLETE_V5_Annotation *this_local;
  
  this->m_type = type;
  if (type == dtDimRadius) {
    pwVar1 = ON_OBSOLETE_V5_DimRadial::DefaultRadiusText();
    SetTextValue(this,pwVar1);
  }
  else if (type == dtDimDiameter) {
    pwVar1 = ON_OBSOLETE_V5_DimRadial::DefaultDiameterText();
    SetTextValue(this,pwVar1);
  }
  else {
    SetTextValue(this,(wchar_t *)0x0);
  }
  SetTextFormula(this,(wchar_t *)0x0);
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::SetType( ON_INTERNAL_OBSOLETE::V5_eAnnotationType type ) 
{ 
  m_type = type;
  if(type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius)
    SetTextValue(ON_OBSOLETE_V5_DimRadial::DefaultRadiusText());
  else if(type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter)
    SetTextValue(ON_OBSOLETE_V5_DimRadial::DefaultDiameterText());
  else
    SetTextValue(0);

  SetTextFormula(0);
}